

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O3

void __thiscall cmOrderDirectories::FindImplicitConflicts(cmOrderDirectories *this)

{
  pointer puVar1;
  cmake *this_00;
  cmGlobalGenerator *pcVar2;
  cmLocalGenerator *pcVar3;
  string *psVar4;
  unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
  *entry;
  pointer puVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string text;
  ostringstream conflicts;
  long *local_248;
  long local_240;
  long local_238 [2];
  string local_228;
  undefined1 local_208 [96];
  _Base_ptr local_1a8;
  char *local_1a0;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  puVar5 = (this->ImplicitDirEntries).
           super__Vector_base<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->ImplicitDirEntries).
           super__Vector_base<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar1) {
    do {
      cmOrderDirectoriesConstraint::FindImplicitConflicts
                ((puVar5->_M_t).
                 super___uniq_ptr_impl<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmOrderDirectoriesConstraint_*,_std::default_delete<cmOrderDirectoriesConstraint>_>
                 .super__Head_base<0UL,_cmOrderDirectoriesConstraint_*,_false>._M_head_impl,
                 (ostringstream *)local_198);
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar1);
  }
  std::__cxx11::stringbuf::str();
  if (local_240 != 0) {
    this_00 = this->GlobalGenerator->CMakeInstance;
    pcVar2 = (cmGlobalGenerator *)(this->Purpose)._M_dataplus._M_p;
    pcVar3 = (cmLocalGenerator *)(this->Purpose)._M_string_length;
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    local_208._0_8_ = (element_type *)0x17;
    local_208._8_8_ = "Cannot generate a safe ";
    local_208._32_8_ = (pointer)0xc;
    local_208._40_8_ = " for target ";
    local_208._56_8_ = (psVar4->_M_dataplus)._M_p;
    local_208._48_8_ = psVar4->_M_string_length;
    local_208._64_8_ = 0x59;
    local_208._72_8_ =
         " because files in some directories may conflict with  libraries in implicit directories:\n"
    ;
    local_1a8 = (_Base_ptr)0x33;
    local_1a0 = "Some of these libraries may not be found correctly.";
    views._M_len = 7;
    views._M_array = (iterator)local_208;
    local_208._16_8_ = pcVar3;
    local_208._24_8_ = pcVar2;
    cmCatViews_abi_cxx11_(&local_228,views);
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_208);
    cmake::IssueMessage(this_00,WARNING,&local_228,(cmListFileBacktrace *)local_208);
    if ((cmMakefile *)local_208._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_248 != local_238) {
    operator_delete(local_248,local_238[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void cmOrderDirectories::FindImplicitConflicts()
{
  // Check for items in implicit link directories that have conflicts
  // in the explicit directories.
  std::ostringstream conflicts;
  for (const auto& entry : this->ImplicitDirEntries) {
    entry->FindImplicitConflicts(conflicts);
  }

  // Skip warning if there were no conflicts.
  std::string const text = conflicts.str();
  if (text.empty()) {
    return;
  }

  // Warn about the conflicts.
  this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
    MessageType::WARNING,
    cmStrCat("Cannot generate a safe ", this->Purpose, " for target ",
             this->Target->GetName(),
             " because files in some directories may "
             "conflict with  libraries in implicit directories:\n",
             text, "Some of these libraries may not be found correctly."),
    this->Target->GetBacktrace());
}